

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O3

void __thiscall
QGraphicsScenePrivate::draw
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QPainter *painter,
          QTransform *viewTransform,QTransform *transformPtr,QRegion *exposedRegion,QWidget *widget,
          qreal opacity,QTransform *effectTransform,bool wasDirtyParentSceneTransform,bool drawItem)

{
  undefined1 *puVar1;
  QStyleOptionGraphicsItem *option;
  QGraphicsItemPrivate *pQVar2;
  long lVar3;
  ulong uVar4;
  QGraphicsItemPrivate *this_00;
  QGraphicsItem *pQVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  QPen *pQVar9;
  QBrush *pQVar10;
  QTransform *pQVar11;
  ulong uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  undefined1 auVar14 [16];
  QBrush oldBrush;
  QPainterPath clipPath;
  QRectF boundingRect;
  byte local_f0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined4 local_a0;
  undefined4 local_9c;
  QTransform local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (item->d_ptr).d;
  lVar3 = (pQVar2->children).d.size;
  uVar4 = *(ulong *)&pQVar2->field_0x160;
  local_f0 = (byte)(uint)(uVar4 >> 0x24) & 1;
  if (lVar3 == 0) {
    uVar13 = 0;
    bVar6 = false;
  }
  else {
    if ((uVar4 >> 0x24 & 1) != 0) {
      pQVar11 = transformPtr;
      if (effectTransform != (QTransform *)0x0) {
        QTransform::operator*(&local_88,transformPtr);
        pQVar11 = &local_88;
      }
      QPainter::setWorldTransform((QTransform *)painter,SUB81(pQVar11,0));
    }
    QGraphicsItemPrivate::ensureSortedChildren((item->d_ptr).d);
    if ((*(ulong *)&(((*(pQVar2->children).d.ptr)->d_ptr).d)->field_0x160 & 0x10000000000) == 0) {
      bVar6 = false;
    }
    else {
      if ((uVar4 >> 0x24 & 1) != 0) {
        QPainter::save();
        local_88.m_matrix[0][2] = 0.0;
        local_88.m_matrix[1][0] = 0.0;
        local_88.m_matrix[0][0] = 0.0;
        local_88.m_matrix[0][1] = 0.0;
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
        cVar8 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
        if (cVar8 == '\0') {
          QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
        }
        else {
          QRectF::normalized();
          QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
        }
        QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
      }
      bVar6 = true;
      if ((pQVar2->children).d.size != 0) {
        uVar13 = 0;
        do {
          pQVar5 = (pQVar2->children).d.ptr[uVar13];
          if (wasDirtyParentSceneTransform) {
            puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
            *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
          }
          uVar12 = *(ulong *)&((pQVar5->d_ptr).d)->field_0x160;
          if ((uVar12 & 0x10000000000) == 0) break;
          if ((0.001 <= opacity) || ((uVar12 & 0x4000000000) != 0)) {
            drawSubtreeRecursive
                      (this,pQVar5,painter,viewTransform,exposedRegion,widget,opacity,
                       effectTransform);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < (ulong)(pQVar2->children).d.size);
        uVar13 = uVar13 & 0xffffffff;
        local_f0 = 0;
        bVar6 = true;
        goto LAB_0060cc71;
      }
      local_f0 = 0;
    }
    uVar13 = 0;
  }
LAB_0060cc71:
  if (drawItem) {
    this_00 = (item->d_ptr).d;
    option = &this->styleOptionTmp;
    if (exposedRegion == (QRegion *)0x0) {
      QRegion::QRegion((QRegion *)&local_88);
    }
    else {
      QRegion::QRegion((QRegion *)&local_88,exposedRegion);
    }
    QGraphicsItemPrivate::initStyleOption
              (this_00,option,transformPtr,(QRegion *)&local_88,exposedRegion == (QRegion *)0x0);
    QRegion::~QRegion((QRegion *)&local_88);
    uVar12 = *(ulong *)&((item->d_ptr).d)->field_0x160 & 0x800000000;
    if ((uVar4 >> 0x24 & 1) == 0 || lVar3 == 0) {
      cVar8 = (char)(uVar12 >> 0x23);
      if (effectTransform != (QTransform *)0x0) {
        QTransform::operator*(&local_88,transformPtr);
        transformPtr = &local_88;
      }
      QPainter::setWorldTransform((QTransform *)painter,SUB81(transformPtr,0));
      if (uVar12 != 0) {
        QPainter::save();
        local_88.m_matrix[0][2] = 0.0;
        local_88.m_matrix[1][0] = 0.0;
        local_88.m_matrix[0][0] = 0.0;
        local_88.m_matrix[0][1] = 0.0;
        local_b0 = &DAT_aaaaaaaaaaaaaaaa;
        (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0);
        cVar7 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
        if (cVar7 == '\0') {
          QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
        }
        else {
          QRectF::normalized();
          QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
        }
        QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
      }
    }
    else if (bVar6) {
      if (uVar12 == 0) {
        QPainter::restore();
        local_f0 = 1;
        cVar8 = '\0';
      }
      else {
        if (effectTransform != (QTransform *)0x0) {
          QTransform::operator*(&local_88,transformPtr);
          transformPtr = &local_88;
        }
        cVar8 = '\0';
        QPainter::setWorldTransform((QTransform *)painter,SUB81(transformPtr,0));
      }
    }
    else if (uVar12 == 0) {
      cVar8 = '\0';
    }
    else {
      QPainter::save();
      local_88.m_matrix[0][2] = 0.0;
      local_88.m_matrix[1][0] = 0.0;
      local_88.m_matrix[0][0] = 0.0;
      local_88.m_matrix[0][1] = 0.0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0,item);
      cVar8 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
      if (cVar8 == '\0') {
        QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
      }
      else {
        QRectF::normalized();
        QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
      cVar8 = '\0';
      local_f0 = 0;
    }
    if (((this->field_0xb9 & 0x40) != 0) && (cVar8 == '\0')) {
      QPainter::save();
    }
    QPainter::setOpacity(opacity);
    if ((*(ushort *)&((item->d_ptr).d)->field_0x162 & 0x160) == 0) {
      (*item->_vptr_QGraphicsItem[10])(item,painter,option,widget);
    }
    else {
      drawItemHelper(this,item,painter,option,widget,
                     (bool)((byte)(*(uint *)&this->field_0xb8 >> 0xe) & 1));
    }
    if (((this->field_0xb9 & 0x40) != 0) || (cVar8 != '\0')) {
      QPainter::restore();
    }
    if (draw(QGraphicsItem*,QPainter*,QTransform_const*,QTransform_const*,QRegion*,QWidget*,double,QTransform_const*,bool,bool)
        ::drawRect == '\0') {
      draw();
    }
    if (draw::drawRect != 0) {
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar9 = (QPen *)QPainter::pen();
      QPen::QPen((QPen *)&local_b0,pQVar9);
      local_b8 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar10 = (QBrush *)QPainter::brush();
      QBrush::QBrush((QBrush *)&local_b8,pQVar10);
      local_9c = 0xaaaaaaaa;
      auVar14 = QColor::fromHsv((int)((ulong)item / 0xff) * -0xff + (int)item,0xff,0xff,0xff);
      local_a8 = auVar14._0_8_;
      local_a0 = auVar14._8_4_;
      local_9c = CONCAT22(local_9c._2_2_,auVar14._12_2_);
      QPainter::setPen((QColor *)painter);
      QPainter::setBrush((BrushStyle)painter);
      local_88.m_matrix[0][2] = -NAN;
      local_88.m_matrix[1][0] = -NAN;
      local_88.m_matrix[0][0] = -NAN;
      local_88.m_matrix[0][1] = -NAN;
      (*item->_vptr_QGraphicsItem[3])(&local_88,item);
      if ((local_88.m_matrix[0][2] == 0.0) && (!NAN(local_88.m_matrix[0][2]))) {
        local_88.m_matrix[0][0] = local_88.m_matrix[0][0] + -1e-05;
        local_88.m_matrix[0][1] = local_88.m_matrix[0][1] + 0.0;
        local_88.m_matrix[0][2] = local_88.m_matrix[0][2] + 2e-05;
        local_88.m_matrix[1][0] = local_88.m_matrix[1][0] + 0.0;
      }
      if ((local_88.m_matrix[1][0] == 0.0) && (!NAN(local_88.m_matrix[1][0]))) {
        local_88.m_matrix[0][0] = local_88.m_matrix[0][0] + 0.0;
        local_88.m_matrix[0][1] = local_88.m_matrix[0][1] + -1e-05;
        local_88.m_matrix[1][0] = local_88.m_matrix[1][0] + 2e-05;
      }
      QPainter::drawRects((QRectF *)painter,(int)&local_88);
      QPainter::setPen((QPen *)painter);
      QPainter::setBrush((QBrush *)painter);
      QBrush::~QBrush((QBrush *)&local_b8);
      QPen::~QPen((QPen *)&local_b0);
    }
  }
  if (lVar3 != 0) {
    if (local_f0 != 0) {
      QPainter::save();
      local_88.m_matrix[0][2] = 0.0;
      local_88.m_matrix[1][0] = 0.0;
      local_88.m_matrix[0][0] = 0.0;
      local_88.m_matrix[0][1] = 0.0;
      local_b0 = &DAT_aaaaaaaaaaaaaaaa;
      (*item->_vptr_QGraphicsItem[4])((QPainterPath *)&local_b0,item);
      cVar8 = QPathClipper::pathToRect((QPainterPath *)&local_b0,(QRectF *)&local_88);
      if (cVar8 == '\0') {
        QPainter::setClipPath((QPainterPath *)painter,(ClipOperation)&local_b0);
      }
      else {
        QRectF::normalized();
        QPainter::setClipRect((QRectF *)painter,(ClipOperation)&local_a8);
      }
      QPainterPath::~QPainterPath((QPainterPath *)&local_b0);
    }
    if (uVar13 < (ulong)(pQVar2->children).d.size) {
      do {
        pQVar5 = (pQVar2->children).d.ptr[uVar13];
        if (wasDirtyParentSceneTransform) {
          puVar1 = &((pQVar5->d_ptr).d)->field_0x160;
          *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20000000000000;
        }
        if ((0.001 <= opacity) ||
           ((*(ulong *)&((pQVar5->d_ptr).d)->field_0x160 & 0x4000000000) != 0)) {
          drawSubtreeRecursive
                    (this,pQVar5,painter,viewTransform,exposedRegion,widget,opacity,effectTransform)
          ;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < (ulong)(pQVar2->children).d.size);
    }
    if ((uVar4 >> 0x24 & 1) != 0) {
      QPainter::restore();
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::draw(QGraphicsItem *item, QPainter *painter, const QTransform *const viewTransform,
                                 const QTransform *const transformPtr, QRegion *exposedRegion, QWidget *widget,
                                 qreal opacity, const QTransform *effectTransform,
                                 bool wasDirtyParentSceneTransform, bool drawItem)
{
    const auto &children = item->d_ptr->children;

    const bool itemIsFullyTransparent = QGraphicsItemPrivate::isOpacityNull(opacity);
    const bool itemClipsChildrenToShape = (item->d_ptr->flags & QGraphicsItem::ItemClipsChildrenToShape);
    const bool itemHasChildren = !children.isEmpty();
    bool setChildClip = itemClipsChildrenToShape;
    bool itemHasChildrenStackedBehind = false;

    int i = 0;
    if (itemHasChildren) {
        if (itemClipsChildrenToShape)
            setWorldTransform(painter, transformPtr, effectTransform);

        item->d_ptr->ensureSortedChildren();
        // Items with the 'ItemStacksBehindParent' flag are put in front of the list
        // so all we have to do is to check the first item.
        itemHasChildrenStackedBehind = (children.at(0)->d_ptr->flags
                                        & QGraphicsItem::ItemStacksBehindParent);

        if (itemHasChildrenStackedBehind) {
            if (itemClipsChildrenToShape) {
                setClip(painter, item);
                setChildClip = false;
            }

            // Draw children behind
            for (i = 0; i < children.size(); ++i) {
                QGraphicsItem *child = children.at(i);
                if (wasDirtyParentSceneTransform)
                    child->d_ptr->dirtySceneTransform = 1;
                if (!(child->d_ptr->flags & QGraphicsItem::ItemStacksBehindParent))
                    break;
                if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                    continue;
                drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
            }
        }
    }

    // Draw item
    if (drawItem) {
        Q_ASSERT(!itemIsFullyTransparent);
        Q_ASSERT(!(item->d_ptr->flags & QGraphicsItem::ItemHasNoContents));
        Q_ASSERT(transformPtr);
        item->d_ptr->initStyleOption(&styleOptionTmp, *transformPtr, exposedRegion
                                     ? *exposedRegion : QRegion(), exposedRegion == nullptr);

        const bool itemClipsToShape = item->d_ptr->flags & QGraphicsItem::ItemClipsToShape;
        bool restorePainterClip = false;

        if (!itemHasChildren || !itemClipsChildrenToShape) {
            // Item does not have children or clip children to shape.
            setWorldTransform(painter, transformPtr, effectTransform);
            if ((restorePainterClip = itemClipsToShape))
                setClip(painter, item);
        } else if (itemHasChildrenStackedBehind){
            // Item clips children to shape and has children stacked behind, which means
            // the painter is already clipped to the item's shape.
            if (itemClipsToShape) {
                // The clip is already correct. Ensure correct world transform.
                setWorldTransform(painter, transformPtr, effectTransform);
            } else {
                // Remove clip (this also ensures correct world transform).
                painter->restore();
                setChildClip = true;
            }
        } else if (itemClipsToShape) {
            // Item clips children and itself to shape. It does not have hildren stacked
            // behind, which means the clip has not yet been set. We set it now and re-use it
            // for the children.
            setClip(painter, item);
            setChildClip = false;
        }

        if (painterStateProtection && !restorePainterClip)
            painter->save();

        painter->setOpacity(opacity);
        if (!item->d_ptr->cacheMode && !item->d_ptr->isWidget)
            item->paint(painter, &styleOptionTmp, widget);
        else
            drawItemHelper(item, painter, &styleOptionTmp, widget, painterStateProtection);

        if (painterStateProtection || restorePainterClip)
            painter->restore();

        static int drawRect = qEnvironmentVariableIntValue("QT_DRAW_SCENE_ITEM_RECTS");
        if (drawRect) {
            QPen oldPen = painter->pen();
            QBrush oldBrush = painter->brush();
            quintptr ptr = reinterpret_cast<quintptr>(item);
            const QColor color = QColor::fromHsv(ptr % 255, 255, 255);
            painter->setPen(color);
            painter->setBrush(Qt::NoBrush);
            painter->drawRect(adjustedItemBoundingRect(item));
            painter->setPen(oldPen);
            painter->setBrush(oldBrush);
        }
    }

    // Draw children in front
    if (itemHasChildren) {
        if (setChildClip)
            setClip(painter, item);

        for (; i < children.size(); ++i) {
            QGraphicsItem *child = children.at(i);
            if (wasDirtyParentSceneTransform)
                child->d_ptr->dirtySceneTransform = 1;
            if (itemIsFullyTransparent && !(child->d_ptr->flags & QGraphicsItem::ItemIgnoresParentOpacity))
                continue;
            drawSubtreeRecursive(child, painter, viewTransform, exposedRegion, widget, opacity, effectTransform);
        }

        // Restore child clip
        if (itemClipsChildrenToShape)
            painter->restore();
    }
}